

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<QString,_QVariant>::erase
          (QMap<QString,_QVariant> *this,const_iterator afirst,const_iterator alast)

{
  bool bVar1;
  map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  const_iterator unaff_retaddr;
  const_iterator in_stack_00000008;
  EraseResult result;
  iterator in_stack_ffffffffffffff88;
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *in_stack_ffffffffffffff98;
  map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
  *this_00;
  const_iterator in_stack_ffffffffffffffb0;
  const_iterator in_stack_ffffffffffffffb8;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                      *)0x3cf9c4);
  if (bVar1) {
    bVar1 = QtPrivate::
            QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
            ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                        *)in_RDI);
    if (bVar1) {
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                    *)0x3cfa62);
      QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
      ::erase((QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
               *)&DAT_aaaaaaaaaaaaaaaa,in_stack_00000008,unaff_retaddr);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::reset((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
               *)this_00,in_stack_ffffffffffffff98);
      iterator::iterator((iterator *)0x3cfaba,in_stack_ffffffffffffff88);
    }
    else {
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                    *)0x3cfa00);
      std::
      map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
      ::erase(in_RDI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      iterator::iterator((iterator *)0x3cfa3e,in_stack_ffffffffffffff88);
    }
  }
  else {
    memset(&local_10,0,8);
    iterator::iterator((iterator *)0x3cf9e3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator erase(const_iterator afirst, const_iterator alast)
    {
        if (!d)
            return iterator();

        if (!d.isShared())
            return iterator(d->m.erase(afirst.i, alast.i));

        auto result = d->erase(afirst.i, alast.i);
        d.reset(result.data);
        return iterator(result.it);
    }